

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O0

string_view gmlc::utilities::string_viewOps::removeBrackets(string_view str)

{
  uchar uVar1;
  string_view input;
  string_view sVar2;
  bool bVar3;
  uchar uVar4;
  const_reference pvVar5;
  uchar *puVar6;
  size_t in_RSI;
  char *in_RDI;
  string_view sVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  string_view ret;
  CharMapper<unsigned_char> *this;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_fffffffffffffff0;
  char *local_8;
  
  this = (CharMapper<unsigned_char> *)0x4;
  input._M_str = in_stack_fffffffffffffff0;
  input._M_len = in_RSI;
  sVar7._M_str = in_RDI;
  sVar7._M_len = (size_t)in_stack_ffffffffffffffd8;
  sVar7 = trim(input,sVar7);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)sVar7._M_len;
  local_8 = sVar7._M_str;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0);
  if ((!bVar3) &&
     ((((pvVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &stack0xffffffffffffffd0), *pvVar5 == '[' ||
        (pvVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &stack0xffffffffffffffd0), *pvVar5 == '(')) ||
       (pvVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            &stack0xffffffffffffffd0), *pvVar5 == '{')) ||
      (pvVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &stack0xffffffffffffffd0), *pvVar5 == '<')))) {
    puVar6 = (uchar *)CLI::std::basic_string_view<char,_std::char_traits<char>_>::back
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 &stack0xffffffffffffffd0);
    uVar1 = *puVar6;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::front
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0);
    uVar4 = CharMapper<unsigned_char>::operator[](this,'\0');
    if (uVar1 == uVar4) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::size
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0);
      bVar8 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this_00,in_RSI,(size_type)in_RDI);
      this_00 = (basic_string_view<char,_std::char_traits<char>_> *)bVar8._M_len;
      local_8 = bVar8._M_str;
    }
  }
  sVar2._M_str = local_8;
  sVar2._M_len = (size_t)this_00;
  return sVar2;
}

Assistant:

std::string_view removeBrackets(std::string_view str)
{
    std::string_view ret = trim(str);
    if (!ret.empty()) {
        if ((ret.front() == '[') || (ret.front() == '(') ||
            (ret.front() == '{') || (ret.front() == '<')) {
            if (static_cast<unsigned char>(ret.back()) == pmap[ret.front()]) {
                return ret.substr(1, ret.size() - 2);
            }
        }
    }
    return ret;
}